

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.hh
# Opt level: O3

void __thiscall
QPDFParser::StackFrame::StackFrame(StackFrame *this,InputSource *input,parser_state_e state)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->dict)._M_t._M_impl.super__Rb_tree_header;
  (this->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->state = state;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  iVar2 = (*input->_vptr_InputSource[4])(input);
  this->offset = CONCAT44(extraout_var,iVar2);
  (this->contents_string)._M_dataplus._M_p = (pointer)&(this->contents_string).field_2;
  (this->contents_string)._M_string_length = 0;
  (this->contents_string).field_2._M_local_buf[0] = '\0';
  this->contents_offset = -1;
  this->null_count = 0;
  return;
}

Assistant:

StackFrame(InputSource& input, parser_state_e state) :
            state(state),
            offset(input.tell())
        {
        }